

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp3.c
# Opt level: O2

int dooptions(Global *global,fppTag *tags)

{
  char ***pppcVar1;
  ushort uVar2;
  char **ppcVar3;
  char *pcVar4;
  DEFBUF *pDVar5;
  ushort **ppuVar6;
  char *pcVar7;
  short sVar8;
  ulong uVar9;
  void *pvVar10;
  ErrorCode EVar11;
  SIZES *pSVar12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  byte bVar16;
  bool bVar17;
  
  pppcVar1 = &global->incend;
  bVar17 = false;
  do {
    if ((tags == (fppTag *)0x0) || (bVar17)) {
      return 0;
    }
    iVar13 = tags->tag;
    switch(iVar13) {
    case 0:
      bVar17 = true;
      goto LAB_00103c1e;
    case 1:
      if (tags->data != (void *)0x0) {
        global->keepcomments = '\x01';
        global->cflag = '\x01';
      }
      break;
    case 2:
      pcVar7 = (char *)tags->data;
      pcVar14 = pcVar7;
      do {
        pcVar4 = pcVar14;
        pcVar14 = pcVar4 + 1;
        if (*pcVar4 == '\0') {
          pcVar14 = "1";
          goto LAB_00103bf6;
        }
      } while (*pcVar4 != '=');
      *pcVar4 = '\0';
LAB_00103bf6:
      pDVar5 = defendel(global,pcVar7,0);
      if (pDVar5 == (DEFBUF *)0x0) {
        return 1;
      }
      pcVar7 = savestring(global,pcVar14);
      pDVar5->repl = pcVar7;
      pDVar5->nargs = -1;
      break;
    case 3:
      global->eflag = '\x01';
      break;
    case 4:
      ppcVar3 = *pppcVar1;
      if (pppcVar1 <= ppcVar3) {
        iVar13 = 0x11;
        EVar11 = FATAL_TOO_MANY_INCLUDE_DIRS;
LAB_00103c65:
        cerror(global,EVar11);
        return iVar13;
      }
      pcVar7 = (char *)tags->data;
      *pppcVar1 = ppcVar3 + 1;
      *ppcVar3 = pcVar7;
      break;
    case 5:
      bVar16 = tags->data != (void *)0x0;
      goto LAB_00103a83;
    case 6:
      bVar16 = (tags->data != (void *)0x0) * '\x02';
LAB_00103a83:
      global->nflag = global->nflag | bVar16;
      break;
    case 7:
      global->cplusplus = tags->data == (void *)0x0;
      break;
    case 8:
      bVar17 = *tags->data == '*';
      pSVar12 = size_table;
      pcVar7 = (char *)((long)tags->data + (ulong)bVar17);
      do {
        sVar8 = pSVar12->bits;
        pcVar14 = pcVar7;
        while( true ) {
          if ((uint)!bVar17 << 9 == (int)sVar8) {
            if (*pcVar7 == '\0') goto LAB_00103c1b;
            EVar11 = WARN_TOO_MANY_VALUES_TO_SIZEOF;
            goto LAB_00103bdd;
          }
          lVar15 = (long)*pcVar14;
          if (lVar15 == 0) {
            bVar17 = false;
            cerror(global,WARN_TOO_FEW_VALUES_TO_SIZEOF,0);
            goto LAB_00103c1e;
          }
          ppuVar6 = __ctype_b_loc();
          uVar2 = (*ppuVar6)[lVar15];
          if ((uVar2 >> 0xb & 1) != 0) break;
          pcVar14 = pcVar14 + 1;
        }
        sVar8 = 0;
        while ((uVar2 >> 0xb & 1) != 0) {
          sVar8 = sVar8 * 10 + (short)(char)lVar15 + -0x30;
          lVar15 = (long)pcVar14[1];
          pcVar14 = pcVar14 + 1;
          uVar2 = (*ppuVar6)[lVar15];
        }
        (&pSVar12->size)[bVar17] = sVar8;
        pSVar12 = pSVar12 + 1;
        pcVar7 = pcVar14;
      } while( true );
    case 9:
      pDVar5 = defendel(global,(char *)tags->data,1);
      if (pDVar5 == (DEFBUF *)0x0) {
        pvVar10 = tags->data;
        EVar11 = WARN_NOT_DEFINED;
        goto LAB_00103bdf;
      }
      break;
    case 10:
      global->wflag = global->wflag + '\x01';
      break;
    case 0xb:
      strcpy(global->work,(char *)tags->data);
      global->first_file = (char *)tags->data;
      break;
    case 0xc:
      global->input = (_func_char_ptr_char_ptr_int_void_ptr *)tags->data;
      break;
    case 0xd:
      global->output = (_func_void_int_void_ptr *)tags->data;
      break;
    case 0xe:
      global->userdata = tags->data;
      break;
    case 0xf:
      global->linelines = tags->data != (void *)0x0;
      break;
    case 0x10:
      global->error = (_func_void_void_ptr_char_ptr___va_list_tag_ptr *)tags->data;
      break;
    case 0x11:
      global->warnillegalcpp = tags->data != (void *)0x0;
      break;
    case 0x12:
      global->outputLINE = tags->data != (void *)0x0;
      break;
    case 0x13:
      global->showversion = tags->data == (void *)0x0;
      break;
    case 0x14:
      global->showincluded = tags->data != (void *)0x0;
      break;
    case 0x15:
      global->showbalance = tags->data != (void *)0x0;
      break;
    case 0x16:
      global->showspace = tags->data != (void *)0x0;
      break;
    case 0x17:
      global->nestcomments = tags->data != (void *)0x0;
      break;
    case 0x18:
      global->warnnestcomments = tags->data != (void *)0x0;
      break;
    case 0x19:
      global->warnnoinclude = tags->data != (void *)0x0;
      break;
    case 0x1a:
      global->outputfile = tags->data != (void *)0x0;
      break;
    case 0x1b:
    case 0x1c:
      uVar9 = (ulong)global->included;
      if (0x13 < uVar9) {
        iVar13 = 0x12;
        EVar11 = FATAL_TOO_MANY_INCLUDE_FILES;
        goto LAB_00103c65;
      }
      global->include[uVar9] = (char *)tags->data;
      global->includeshow[uVar9] = iVar13 == 0x1b;
      global->included = global->included + '\x01';
      break;
    case 0x1d:
      global->rightconcat = tags->data != (void *)0x0;
      break;
    case 0x1e:
      global->initialfunc = (char *)tags->data;
      break;
    case 0x1f:
      pcVar7 = (char *)tags->data;
      iVar13 = global->excluded;
      global->excluded = iVar13 + 1;
      global->excludedinit[iVar13] = pcVar7;
      break;
    case 0x20:
      global->outputfunctions = tags->data != (void *)0x0;
      break;
    case 0x21:
      global->webmode = tags->data != (void *)0x0;
      break;
    default:
      EVar11 = WARN_INTERNAL_ERROR;
LAB_00103bdd:
      pvVar10 = (void *)0x0;
LAB_00103bdf:
      bVar17 = false;
      cerror(global,EVar11,pvVar10);
      goto LAB_00103c1e;
    }
LAB_00103c1b:
    bVar17 = false;
LAB_00103c1e:
    tags = tags + 1;
  } while( true );
}

Assistant:

int dooptions(struct Global *global, struct fppTag *tags)
{
  /*
   * dooptions is called to process command line arguments (-Detc).
   * It is called only at cpp startup.
   */
  DEFBUF *dp;
  char end=FALSE; /* end of taglist */

  while(tags && !end) {
    switch(tags->tag) {
    case FPPTAG_END:
      end=TRUE;
      break;
    case FPPTAG_INITFUNC:
      global->initialfunc = (char *) tags->data;
      break;
    case FPPTAG_DISPLAYFUNCTIONS:
      global->outputfunctions = tags->data?1:0;
      break;
    case FPPTAG_RIGHTCONCAT:
      global->rightconcat = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTMAIN:
      global->outputfile = tags->data?1:0;
      break;
    case FPPTAG_NESTED_COMMENTS:
      global->nestcomments = tags->data?1:0;
      break;
    case FPPTAG_WARNMISSINCLUDE:
      global->warnnoinclude = tags->data?1:0;
      break;
    case FPPTAG_WARN_NESTED_COMMENTS:
      global->warnnestcomments =  tags->data?1:0;
      break;
    case FPPTAG_OUTPUTSPACE:
      global->showspace = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTBALANCE:
      global->showbalance = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTINCLUDES:
      global->showincluded = tags->data?1:0;
      break;
    case FPPTAG_IGNOREVERSION:
#ifdef GDLPP
      global->showversion = tags->data?0:1;
#else
      global->showversion = tags->data?1:0;
#endif
      break;
    case FPPTAG_WARNILLEGALCPP:
      global->warnillegalcpp = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTLINE:
      global->outputLINE = tags->data?1:0;
      break;
    case FPPTAG_KEEPCOMMENTS:
      if(tags->data) {
	global->cflag = TRUE;
	global->keepcomments = TRUE;
      }
      break;
    case FPPTAG_DEFINE:
      /*
       * If the option is just "-Dfoo", make it -Dfoo=1
       */
      {
	char *symbol=(char *)tags->data;
	char *text=symbol;
	while (*text != EOS && *text != '=')
	  text++;
	if (*text == EOS)
	  text = "1";
	else
	  *text++ = EOS;
	/*
	 * Now, save the word and its definition.
	 */
	dp = defendel(global, symbol, FALSE);
	if(!dp)
	  return(FPP_OUT_OF_MEMORY);
	dp->repl = savestring(global, text);
	dp->nargs = DEF_NOARGS;
      }
      break;
    case FPPTAG_IGNORE_NONFATAL:
      global->eflag = TRUE;
      break;
    case FPPTAG_INCLUDE_DIR:
      if (global->incend >= &global->incdir[NINCLUDE]) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_DIRS);
	  return(FPP_TOO_MANY_INCLUDE_DIRS);
      }
      *global->incend++ = (char *)tags->data;
      break;
    case FPPTAG_INCLUDE_FILE:
    case FPPTAG_INCLUDE_MACRO_FILE:
      if (global->included >= NINCLUDE) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_FILES);
	  return(FPP_TOO_MANY_INCLUDE_FILES);
      }
      global->include[global->included] = (char *)tags->data;

      global->includeshow[global->included] =
	  (tags->tag == FPPTAG_INCLUDE_FILE);

      global->included++;
      break;
    case FPPTAG_BUILTINS:
      global->nflag|=(tags->data?NFLAG_BUILTIN:0);
      break;
    case FPPTAG_PREDEFINES:
      global->nflag|=(tags->data?NFLAG_PREDEFINE:0);
      break;
    case FPPTAG_IGNORE_CPLUSPLUS:
      global->cplusplus=!tags->data;
      break;
    case FPPTAG_SIZEOF_TABLE:
      {
	SIZES *sizp;	/* For -S		*/
	int size;	/* For -S		*/
	int isdatum;	/* FALSE for -S*	*/
	int endtest;	/* For -S		*/

	char *text=(char *)tags->data;

	sizp = size_table;
	if ( (isdatum = (*text != '*')) ) /* If it's just -S,     */
	  endtest = T_FPTR;	/* Stop here		*/
	else {			/* But if it's -S*      */
	  text++;		/* Step over '*'        */
	  endtest = 0;		/* Stop at end marker	*/
	}
	while (sizp->bits != endtest && *text != EOS) {
	  if (!isdigit(*text)) {    /* Skip to next digit   */
	    text++;
	    continue;
	  }
	  size = 0;		/* Compile the value	*/
	  while (isdigit(*text)) {
	    size *= 10;
	    size += (*text++ - '0');
	  }
	  if (isdatum)
	    sizp->size = size;	/* Datum size		*/
	  else
	    sizp->psize = size; /* Pointer size 	*/
	  sizp++;
	}
	if (sizp->bits != endtest)
	  cwarn(global, WARN_TOO_FEW_VALUES_TO_SIZEOF, NULL);
	else if (*text != EOS)
	  cwarn(global, WARN_TOO_MANY_VALUES_TO_SIZEOF, NULL);
      }
      break;
    case FPPTAG_UNDEFINE:
      if (defendel(global, (char *)tags->data, TRUE) == NULL)
	cwarn(global, WARN_NOT_DEFINED, tags->data);
      break;
    case FPPTAG_OUTPUT_DEFINES:
      global->wflag++;
      break;
    case FPPTAG_INPUT_NAME:
      strcpy(global->work, tags->data);    /* Remember input filename */
      global->first_file=tags->data;
      break;
    case FPPTAG_INPUT:
      global->input=(char *(*)(char *, int, void *))tags->data;
      break;
    case FPPTAG_OUTPUT:
      global->output=(void (*)(int, void *))tags->data;
      break;      
    case FPPTAG_ERROR:
      global->error=(void (*)(void *, char *, va_list))tags->data;
      break;
    case FPPTAG_USERDATA:
      global->userdata=tags->data;
      break;
    case FPPTAG_LINE:
      global->linelines= tags->data?1:0;
      break;
    case FPPTAG_EXCLFUNC:
      global->excludedinit[ global->excluded++ ] = (char *)tags->data;
      break;
    case FPPTAG_WEBMODE:
      global->webmode=(tags->data?1:0);
      break;
    default:
      cwarn(global, WARN_INTERNAL_ERROR, NULL);
      break;
    }
    tags++;
  }
  return(0);
}